

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clu.c
# Opt level: O1

CLU * CLU_NewFromFile(FILE *fp,LPStatus *status)

{
  _Bool _Var1;
  LPStatus LVar2;
  uint8_t (*pauVar3) [3];
  long lVar4;
  uint8_t (*dest) [3];
  
  pauVar3 = (uint8_t (*) [3])malloc(0x300);
  if ((CLU *)pauVar3 == (CLU *)0x0) {
    LVar2 = LUNAPURPURA_ERROR;
  }
  else {
    _Var1 = ValidateMagicF(fp,CLU_MAGIC,8);
    if (_Var1) {
      lVar4 = 0x100;
      dest = pauVar3;
      do {
        (*(uint8_t (*) [3])*dest)[2] = '\0';
        *(uint8_t *)((long)dest + 0) = '\0';
        *(uint8_t *)((long)dest + 1) = '\0';
        fseek((FILE *)fp,2,1);
        ReadUint8(fp,1,*dest);
        fseek((FILE *)fp,1,1);
        ReadUint8(fp,1,*(uint8_t (*) [3])*dest + 1);
        fseek((FILE *)fp,1,1);
        ReadUint8(fp,1,*(uint8_t (*) [3])*dest + 2);
        fseek((FILE *)fp,1,1);
        dest = dest + 1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      LVar2 = LUNAPURPURA_OK;
      goto LAB_00106f32;
    }
    LVar2 = LUNAPURPURA_BADMAGIC;
  }
  pauVar3 = (uint8_t (*) [3])0x0;
LAB_00106f32:
  *status = LVar2;
  return (CLU *)pauVar3;
}

Assistant:

CLU *
CLU_NewFromFile(FILE *fp, LPStatus *status)
{
	CLU *clu = malloc(sizeof(CLU));

	if (!clu) {
		*status = LUNAPURPURA_ERROR;
		return NULL;
	}

	uint8_t *cluptr = NULL;

	if (!ValidateMagicF(fp, CLU_MAGIC, CLU_MAGIC_LEN)) {
		*status = LUNAPURPURA_BADMAGIC;
		return NULL;
	}

	for (int i = 0; i < CLU_NELEMENTS; i++) {
		memset(clu->array[i], 0, sizeof(clu->array[i]));
		cluptr = clu->array[i];

		fseek(fp, 2L, SEEK_CUR); /* skip marker */
		ReadUint8(fp, 1, cluptr); /* R */

		cluptr++;
		fseek(fp, 1L, SEEK_CUR);
		ReadUint8(fp, 1, cluptr); /* G */

		cluptr++;
		fseek(fp, 1L, SEEK_CUR);
		ReadUint8(fp, 1, cluptr); /* B */

		fseek(fp, 1L, SEEK_CUR); /* go to next marker */
	}

	*status = LUNAPURPURA_OK;
	return clu;
}